

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sound.cpp
# Opt level: O3

void SdlCallback(void *pUnused,Uint8 *pStream,int Len)

{
  int *piVar1;
  CSample *pCVar2;
  uint uVar3;
  uint uVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar12;
  short *psVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  uint uVar17;
  uint i;
  long lVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  int iVar11;
  
  iVar11 = Len + 3;
  if (-1 < Len) {
    iVar11 = Len;
  }
  uVar10 = iVar11 >> 2;
  mem_zero(m_pMixBuffer,m_MaxFrames << 3);
  uVar4 = m_MaxFrames;
  uVar12 = m_MaxFrames;
  if (uVar10 < m_MaxFrames) {
    uVar12 = uVar10;
  }
  lock_wait(m_SoundLock);
  iVar11 = m_SoundVolume;
  lVar18 = 0;
  do {
    piVar5 = m_pMixBuffer;
    fVar21 = m_MaxDistance;
    pCVar2 = m_aVoices[lVar18].m_pSample;
    if (pCVar2 != (CSample *)0x0) {
      iVar7 = pCVar2->m_Channels;
      iVar6 = m_aVoices[lVar18].m_Tick;
      uVar17 = pCVar2->m_NumFrames - iVar6;
      iVar16 = (m_aVoices[lVar18].m_pChannel)->m_Vol;
      psVar13 = pCVar2->m_pData + iVar6 * iVar7;
      uVar3 = uVar17;
      if (uVar12 < uVar17) {
        uVar3 = uVar12;
      }
      iVar8 = iVar16;
      iVar9 = iVar16;
      if ((m_aVoices[lVar18].m_Flags & 2) != 0) {
        iVar8 = m_aVoices[lVar18].m_Y - m_CenterY;
        fVar19 = (float)(m_aVoices[lVar18].m_X - m_CenterX);
        fVar20 = SQRT(fVar19 * fVar19 + (float)(iVar8 * iVar8));
        iVar8 = 0;
        if (0.0 <= fVar20) {
          iVar9 = 0;
          if (fVar20 < m_MaxDistance) {
            fVar19 = 0.5 - (fVar19 / m_MaxDistance) * 0.5;
            if (fVar19 < 0.0) {
              fVar22 = sqrtf(fVar19);
            }
            else {
              fVar22 = SQRT(fVar19);
            }
            fVar19 = 1.0 - fVar19;
            if (fVar19 < 0.0) {
              fVar19 = sqrtf(fVar19);
            }
            else {
              fVar19 = SQRT(fVar19);
            }
            fVar21 = (float)iVar16 * (1.0 - fVar20 / fVar21);
            iVar6 = m_aVoices[lVar18].m_Tick;
            iVar8 = (int)(fVar22 * fVar21);
            iVar9 = (int)(fVar21 * fVar19);
          }
        }
        else {
          iVar9 = 0;
        }
      }
      if (uVar3 != 0) {
        uVar14 = uVar10;
        if (uVar4 < uVar10) {
          uVar14 = uVar4;
        }
        if (uVar17 <= uVar14) {
          uVar14 = uVar17;
        }
        lVar15 = 0;
        do {
          piVar1 = piVar5 + lVar15 * 2;
          *piVar1 = *piVar1 + *psVar13 * iVar8;
          piVar1 = piVar5 + lVar15 * 2 + 1;
          *piVar1 = *piVar1 + *(short *)((long)psVar13 + (ulong)((uint)((long)iVar7 != 1) * 2)) *
                              iVar9;
          lVar15 = lVar15 + 1;
          psVar13 = psVar13 + iVar7;
        } while (uVar14 != (uint)lVar15);
        iVar6 = iVar6 + uVar3;
        m_aVoices[lVar18].m_Tick = iVar6;
      }
      if (iVar6 == (m_aVoices[lVar18].m_pSample)->m_NumFrames) {
        if ((m_aVoices[lVar18].m_Flags & 1) == 0) {
          m_aVoices[lVar18].m_pSample = (CSample *)0x0;
        }
        else {
          m_aVoices[lVar18].m_Tick = 0;
        }
      }
    }
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x40);
  lock_unlock(m_SoundLock);
  piVar5 = m_pMixBuffer;
  if (uVar12 != 0) {
    iVar7 = 1;
    do {
      iVar6 = (piVar5[iVar7 + -1] * iVar11) / 0x65 >> 8;
      if (0x7ffe < iVar6) {
        iVar6 = 0x7fff;
      }
      if (iVar6 < -0x7fff) {
        iVar6 = -0x8000;
      }
      iVar16 = (piVar5[iVar7] * iVar11) / 0x65 >> 8;
      *(short *)(pStream + (long)(iVar7 + -1) * 2) = (short)iVar6;
      if (0x7ffe < iVar16) {
        iVar16 = 0x7fff;
      }
      if (iVar16 < -0x7fff) {
        iVar16 = -0x8000;
      }
      *(short *)(pStream + (long)iVar7 * 2) = (short)iVar16;
      iVar7 = iVar7 + 2;
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  return;
}

Assistant:

static void SdlCallback(void *pUnused, Uint8 *pStream, int Len)
{
	(void)pUnused;
	Mix((short *)pStream, Len/2/2);
}